

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<char_const(&)[4],char_const(&)[4]>
          (String *__return_storage_ptr__,kj *this,char (*params) [4],char (*params_1) [4])

{
  char (*pacVar1) [4];
  ArrayPtr<const_char> local_40;
  ArrayPtr<const_char> local_30;
  char (*local_20) [4];
  char (*params_local_1) [4];
  char (*params_local) [4];
  
  local_20 = params;
  params_local_1 = (char (*) [4])this;
  params_local = (char (*) [4])__return_storage_ptr__;
  pacVar1 = ::const((char (*) [4])this);
  local_30 = toCharSequence<char_const(&)[4]>(pacVar1);
  pacVar1 = ::const(local_20);
  local_40 = toCharSequence<char_const(&)[4]>(pacVar1);
  _::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_30,&local_40,(ArrayPtr<const_char> *)params_1);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}